

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metropolis2.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  time_t tVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_60;
  double local_50;
  double local_48;
  
  iVar6 = 0;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  uVar4 = 1;
  local_60 = 0.0;
  local_48 = 0.0;
  iVar5 = 0;
  local_50 = 1.0;
  do {
    iVar1 = rand();
    iVar2 = rand();
    dVar9 = ((double)iVar1 / 2147483647.0 + -0.5) * 0.5;
    dVar8 = ((double)iVar2 / 2147483647.0 + -0.5) * 0.5;
    dVar9 = dVar9 + dVar9 + local_60;
    dVar8 = dVar8 + dVar8 + local_48;
    iVar1 = rand();
    dVar7 = exp((dVar9 * dVar8 + dVar9 * dVar9 + dVar8 * dVar8) * -0.5 +
                (local_60 * local_48 + local_60 * local_60 + local_48 * local_48) * 0.5);
    if (dVar7 <= (double)iVar1 / 2147483647.0) {
      dVar9 = local_60;
      dVar8 = local_48;
    }
    local_48 = dVar8;
    local_60 = dVar9;
    iVar5 = iVar5 + (uint)((double)iVar1 / 2147483647.0 < dVar7);
    if ((int)(uVar4 / 10) * -10 + 1 == iVar6) {
      printf("%.10f\t%.10f\t%f\n",local_60,local_48,(double)iVar5 / local_50);
    }
    local_50 = local_50 + 1.0;
    uVar4 = (ulong)((int)uVar4 + 1);
    iVar6 = iVar6 + -1;
  } while (iVar6 != -10000);
  return 0;
}

Assistant:

int main(void) {
    int niter = 10000; // サンプルの数
    double step_size_x = 0.5e0;
    double step_size_y = 0.5e0;

    srand((unsigned) time(nullptr));

    double x = 0e0;
    double y = 0e0;
    int naccept = 0; // 受理回数カウンター

    for (int iter = 1; iter < niter + 1; iter++) {
        double backup_x = x;
        double backup_y = y;
        double action_init = 0.5e0 * (x * x + y * y + x * y);

        double dx = (double) rand() / RAND_MAX;
        double dy = (double) rand() / RAND_MAX;
        dx = (dx - 0.5e0) * step_size_x * 2e0;
        dy = (dy - 0.5e0) * step_size_y * 2e0;
        x += dx;
        y += dy;

        double action_fin = 0.5e0 * (x * x + y * y + x * y);

        // メトロポリステスト
        double metropolis = (double) rand() / RAND_MAX;
        if (exp(action_init - action_fin) > metropolis) {
            // 受理
            naccept++;
        } else {
            // 棄却して元に戻す
            x = backup_x;
            y = backup_y;
        }
        if (iter % 10 == 0) {
            printf("%.10f\t%.10f\t%f\n", x, y, (double) naccept / iter);
        }
    }
}